

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,value_type_conflict3 index,
          aiMatrix4x4 *node_global_transform,aiNode *nd)

{
  pointer paVar1;
  pointer paVar2;
  _Rb_tree_header *p_Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  _Rb_tree_color _Var14;
  pointer paVar15;
  pointer paVar16;
  aiVector3D *paVar17;
  ShapeGeometry *this_00;
  pointer ppaVar18;
  pointer ppaVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  aiAnimMesh *paVar25;
  size_type sVar26;
  Model *model_00;
  _Base_ptr p_Var27;
  aiMesh *out;
  pointer paVar28;
  Skin *pSVar29;
  int *piVar30;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *pvVar31
  ;
  aiVector3D *paVar32;
  ulong *puVar33;
  pointer *ppaVar34;
  long lVar35;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar36;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar37;
  ulong uVar38;
  void *__s;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvVar39;
  aiColor4D *paVar40;
  uint *puVar41;
  mapped_type *pmVar42;
  pointer *ppaVar43;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar44;
  pointer puVar45;
  aiAnimMesh **ppaVar46;
  aiFace *paVar47;
  pointer paVar48;
  _Base_ptr p_Var49;
  ulong uVar50;
  uint uVar51;
  ulong uVar52;
  iterator iVar53;
  undefined4 uVar54;
  MeshGeometry *pMVar55;
  _Base_ptr p_Var56;
  _Base_ptr p_Var57;
  uint uVar58;
  float fVar59;
  float fVar60;
  uint in_cursor;
  aiAnimMesh *animMesh;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  uint outIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reverseMapping;
  uint count;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  translateIndexMap;
  key_type local_194;
  MeshGeometry *local_190;
  ulong local_188;
  pointer *local_180;
  pointer local_178;
  pointer local_170;
  aiFace *local_168;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_160;
  aiAnimMesh *local_158;
  pointer local_150;
  pointer *local_148;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  void *local_118;
  iterator iStack_110;
  aiAnimMesh **local_108;
  FBXConverter *local_f8;
  undefined4 local_f0;
  _Rb_tree_color local_ec;
  aiFace *local_e8;
  int *local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  string local_b8;
  pointer local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  aiMatrix4x4 *local_80;
  Model *local_78;
  int *local_70;
  uint *local_68;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  local_178 = (pointer)CONCAT44(local_178._4_4_,index);
  local_80 = node_global_transform;
  out = SetupEmptyMesh(this,&mesh->super_Geometry,nd);
  paVar28 = (pointer)MeshGeometry::GetMaterialIndices(mesh);
  local_138 = MeshGeometry::GetVertices(mesh);
  local_128 = MeshGeometry::GetFaceIndexCounts(mesh);
  local_f8 = this;
  local_78 = model;
  if (this->doc->settings->readWeights == true) {
    pMVar55 = mesh;
    pSVar29 = Geometry::DeformerSkin(&mesh->super_Geometry);
    uVar54 = (undefined4)CONCAT71((int7)((ulong)pMVar55 >> 8),pSVar29 != (Skin *)0x0);
  }
  else {
    uVar54 = 0;
  }
  piVar30 = *(int **)paVar28;
  if (piVar30 != *(int **)&paVar28->z) {
    puVar45 = (local_128->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar51 = 0;
    uVar58 = 0;
    do {
      if (*piVar30 == (uint)local_178) {
        uVar51 = uVar51 + 1;
        uVar58 = uVar58 + *puVar45;
      }
      piVar30 = piVar30 + 1;
      puVar45 = puVar45 + 1;
    } while (piVar30 != *(int **)&paVar28->z);
    if (uVar51 != 0) {
      local_190 = mesh;
      if (uVar58 == 0) {
        __assert_fail("count_vertices",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                      ,0x4ed,
                      "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, const aiMatrix4x4 &, aiNode &)"
                     );
      }
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var3 = &local_60._M_impl.super__Rb_tree_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_f0 = uVar54;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
      if (((char)uVar54 != '\0') ||
         (pvVar31 = Geometry::GetBlendShapes(&mesh->super_Geometry),
         (pvVar31->
         super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
         )._M_impl.super__Vector_impl_data._M_finish !=
         (pvVar31->
         super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
         )._M_impl.super__Vector_impl_data._M_start)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_d8,(ulong)uVar58);
      }
      out->mNumVertices = uVar58;
      paVar32 = (aiVector3D *)operator_new__((ulong)uVar58 * 0xc);
      memset(paVar32,0,(((ulong)uVar58 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      out->mVertices = paVar32;
      out->mNumFaces = uVar51;
      uVar38 = (ulong)uVar51;
      puVar33 = (ulong *)operator_new__(uVar38 * 0x10 + 8);
      *puVar33 = uVar38;
      local_168 = (aiFace *)(puVar33 + 1);
      paVar47 = local_168;
      do {
        paVar47->mNumIndices = 0;
        paVar47->mIndices = (uint *)0x0;
        paVar47 = paVar47 + 1;
      } while (paVar47 != (aiFace *)(puVar33 + uVar38 * 2 + 1));
      out->mFaces = local_168;
      local_150 = paVar28;
      ppaVar34 = (pointer *)MeshGeometry::GetNormals(local_190);
      lVar35 = (long)ppaVar34[1] - (long)*ppaVar34;
      if (lVar35 != 0) {
        paVar28 = (local_138->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar48 = (local_138->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        if (lVar35 != (long)paVar48 - (long)paVar28) {
          __assert_fail("normals.size() == vertices.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                        ,0x501,
                        "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, const aiMatrix4x4 &, aiNode &)"
                       );
        }
        auVar20._8_8_ = 0;
        auVar20._0_8_ = (lVar35 >> 2) * -0x5555555555555555;
        uVar38 = 0xffffffffffffffff;
        if (SUB168(auVar20 * ZEXT816(0xc),8) == 0) {
          uVar38 = SUB168(auVar20 * ZEXT816(0xc),0);
        }
        paVar32 = (aiVector3D *)operator_new__(uVar38);
        lVar35 = (long)paVar48 - (long)paVar28;
        if (lVar35 != 0) {
          memset(paVar32,0,((lVar35 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        out->mNormals = paVar32;
      }
      pMVar55 = local_190;
      pvVar36 = MeshGeometry::GetTangents(local_190);
      local_180 = (pointer *)MeshGeometry::GetBinormals(pMVar55);
      local_98 = (pointer)0x0;
      uStack_90 = 0;
      local_88 = 0;
      paVar28 = (pvVar36->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      paVar48 = (pvVar36->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      local_148 = ppaVar34;
      local_140 = pvVar36;
      if (paVar48 != paVar28) {
        if (local_180[1] == *local_180) {
          if ((long)ppaVar34[1] - (long)*ppaVar34 == 0) {
            local_180 = (pointer *)0x0;
            goto LAB_00172a63;
          }
          local_180 = &local_98;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_180,
                     ((long)ppaVar34[1] - (long)*ppaVar34 >> 2) * -0x5555555555555555);
          paVar15 = (local_140->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          paVar28 = (local_140->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          paVar48 = paVar28;
          if (paVar28 != paVar15) {
            uVar51 = 1;
            uVar38 = 0;
            paVar28 = paVar15;
            do {
              fVar59 = paVar28[uVar38].x;
              fVar60 = (*local_148)[uVar38].x;
              paVar48 = *local_148 + uVar38;
              uVar7 = paVar48->y;
              uVar12 = paVar48->z;
              uVar8 = paVar28[uVar38].y;
              uVar13 = paVar28[uVar38].z;
              local_98[uVar38].x = (float)uVar13 * (float)uVar7 - (float)uVar12 * (float)uVar8;
              local_98[uVar38].y = fVar59 * (float)uVar12 - fVar60 * (float)uVar13;
              local_98[uVar38].z = fVar60 * (float)uVar8 - fVar59 * (float)uVar7;
              uVar38 = (ulong)uVar51;
              paVar28 = (local_140->
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              paVar48 = (local_140->
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
              uVar50 = ((long)paVar48 - (long)paVar28 >> 2) * -0x5555555555555555;
              uVar51 = uVar51 + 1;
            } while (uVar38 <= uVar50 && uVar50 - uVar38 != 0);
          }
        }
        paVar15 = (local_138->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar16 = (local_138->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar35 = (long)paVar16 - (long)paVar15;
        if (((long)paVar48 - (long)paVar28 != lVar35) ||
           ((long)local_180[1] - (long)*local_180 != (long)paVar48 - (long)paVar28)) {
          __assert_fail("tangents.size() == vertices.size() && binormals->size() == vertices.size()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                        ,0x51c,
                        "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, const aiMatrix4x4 &, aiNode &)"
                       );
        }
        auVar21._8_8_ = 0;
        auVar21._0_8_ = (lVar35 >> 2) * -0x5555555555555555;
        uVar38 = 0xffffffffffffffff;
        if (SUB168(auVar21 * ZEXT816(0xc),8) == 0) {
          uVar38 = SUB168(auVar21 * ZEXT816(0xc),0);
        }
        paVar32 = (aiVector3D *)operator_new__(uVar38);
        lVar35 = (long)paVar16 - (long)paVar15;
        if (lVar35 != 0) {
          memset(paVar32,0,((lVar35 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        out->mTangents = paVar32;
        paVar28 = (local_138->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar48 = (local_138->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = ((long)paVar48 - (long)paVar28 >> 2) * -0x5555555555555555;
        uVar38 = 0xffffffffffffffff;
        if (SUB168(auVar22 * ZEXT816(0xc),8) == 0) {
          uVar38 = SUB168(auVar22 * ZEXT816(0xc),0);
        }
        paVar32 = (aiVector3D *)operator_new__(uVar38);
        lVar35 = (long)paVar48 - (long)paVar28;
        if (lVar35 != 0) {
          memset(paVar32,0,((lVar35 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        out->mBitangents = paVar32;
      }
LAB_00172a63:
      local_188 = 0x2c;
      do {
        pvVar37 = MeshGeometry::GetTextureCoords(local_190,(int)local_188 - 0x2c);
        if ((pvVar37->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start ==
            (pvVar37->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          local_188 = (ulong)((int)local_188 - 0x2c);
          goto LAB_00172b32;
        }
        paVar28 = (local_138->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar48 = (local_138->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = ((long)paVar48 - (long)paVar28 >> 2) * -0x5555555555555555;
        uVar38 = SUB168(auVar23 * ZEXT816(0xc),0);
        if (SUB168(auVar23 * ZEXT816(0xc),8) != 0) {
          uVar38 = 0xffffffffffffffff;
        }
        __s = operator_new__(uVar38);
        lVar35 = (long)paVar48 - (long)paVar28;
        if (lVar35 != 0) {
          memset(__s,0,((lVar35 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        *(void **)((long)out + local_188 * 8 + -0xf0) = __s;
        *(undefined4 *)((long)out->mColors + local_188 * 4 + -0x30) = 2;
        local_188 = local_188 + 1;
      } while (local_188 != 0x34);
      local_188 = 8;
LAB_00172b32:
      local_160 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
      do {
        pvVar39 = MeshGeometry::GetVertexColors(local_190,(uint)local_160);
        if ((pvVar39->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start ==
            (pvVar39->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_00172bce;
        paVar28 = (local_138->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar48 = (local_138->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar35 = (long)paVar48 - (long)paVar28 >> 2;
        uVar38 = lVar35 * -0x5555555555555550;
        paVar40 = (aiColor4D *)
                  operator_new__(-(ulong)((ulong)(lVar35 * -0x5555555555555555) >> 0x3c != 0) |
                                 uVar38);
        if (paVar48 != paVar28) {
          memset(paVar40,0,uVar38);
        }
        out->mColors[(long)local_160] = paVar40;
        local_160 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                    ((long)&(local_160->
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
      } while (local_160 != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x8);
      local_160 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x8;
LAB_00172bce:
      local_194 = 0;
      piVar30 = *(int **)local_150;
      local_70 = *(int **)&local_150->z;
      if (piVar30 != local_70) {
        puVar41 = (local_128->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar50 = local_188 & 0xffffffff;
        uVar38 = (ulong)local_160 & 0xffffffff;
        pvVar44 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        do {
          paVar47 = local_168;
          uVar51 = *puVar41;
          local_68 = puVar41;
          if (*piVar30 == (uint)local_178) {
            local_168->mNumIndices = uVar51;
            local_e0 = piVar30;
            puVar41 = (uint *)operator_new__((long)(ulong)uVar51 * 4);
            local_e8 = paVar47 + 1;
            paVar47->mIndices = puVar41;
            if (uVar51 - 1 < 3) {
              out->mPrimitiveTypes =
                   out->mPrimitiveTypes | *(uint *)(&DAT_001f5944 + (ulong)(uVar51 - 1) * 4);
LAB_00172c84:
              paVar28 = (pointer)0x0;
              local_170 = (pointer)(ulong)uVar51;
              do {
                local_168->mIndices[(long)paVar28] = (uint)pvVar44;
                local_150 = paVar28;
                local_128 = pvVar44;
                if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish !=
                    local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start) {
                  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)pvVar44] = local_194;
                  pmVar42 = std::
                            map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                          *)&local_60,&local_194);
                  *pmVar42 = (mapped_type)local_128;
                }
                uVar52 = (ulong)local_194;
                paVar28 = (local_138->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                paVar32 = out->mVertices;
                paVar32[(long)pvVar44].z = paVar28[uVar52].z;
                paVar28 = paVar28 + uVar52;
                fVar59 = paVar28->y;
                paVar32 = paVar32 + (long)pvVar44;
                paVar32->x = paVar28->x;
                paVar32->y = fVar59;
                paVar32 = out->mNormals;
                if (paVar32 != (aiVector3D *)0x0) {
                  paVar28 = *local_148;
                  paVar32[(long)pvVar44].z = paVar28[uVar52].z;
                  paVar28 = paVar28 + uVar52;
                  fVar59 = paVar28->y;
                  paVar32[(long)pvVar44].x = paVar28->x;
                  paVar32[(long)pvVar44].y = fVar59;
                }
                paVar32 = out->mTangents;
                if (paVar32 != (aiVector3D *)0x0) {
                  paVar28 = (local_140->
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  paVar32[(long)pvVar44].z = paVar28[uVar52].z;
                  paVar28 = paVar28 + uVar52;
                  fVar59 = paVar28->y;
                  paVar32[(long)pvVar44].x = paVar28->x;
                  paVar32[(long)pvVar44].y = fVar59;
                  paVar28 = *local_180;
                  paVar32 = out->mBitangents;
                  paVar32[(long)pvVar44].z = paVar28[uVar52].z;
                  paVar28 = paVar28 + uVar52;
                  fVar59 = paVar28->y;
                  paVar32 = paVar32 + (long)pvVar44;
                  paVar32->x = paVar28->x;
                  paVar32->y = fVar59;
                }
                if ((float)local_188 != 0.0) {
                  uVar52 = 0;
                  do {
                    pvVar37 = MeshGeometry::GetTextureCoords(local_190,(uint)uVar52);
                    paVar17 = out->mTextureCoords[uVar52];
                    paVar1 = (pvVar37->
                             super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + local_194;
                    fVar59 = paVar1->y;
                    paVar32 = paVar17 + (long)pvVar44;
                    paVar32->x = paVar1->x;
                    paVar32->y = fVar59;
                    paVar17[(long)pvVar44].z = 0.0;
                    uVar52 = uVar52 + 1;
                  } while (uVar50 != uVar52);
                }
                if ((int)local_160 != 0) {
                  uVar52 = 0;
                  do {
                    pvVar39 = MeshGeometry::GetVertexColors(local_190,(uint)uVar52);
                    paVar2 = (pvVar39->
                             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + local_194;
                    fVar59 = paVar2->g;
                    fVar60 = paVar2->b;
                    fVar24 = paVar2->a;
                    paVar40 = out->mColors[uVar52] + (long)pvVar44;
                    paVar40->r = paVar2->r;
                    paVar40->g = fVar59;
                    paVar40->b = fVar60;
                    paVar40->a = fVar24;
                    uVar52 = uVar52 + 1;
                  } while (uVar38 != uVar52);
                }
                paVar28 = (pointer)((long)&local_150->x + 1);
                pvVar44 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          (ulong)((int)local_128 + 1);
                local_194 = local_194 + 1;
              } while (paVar28 != local_170);
            }
            else {
              out->mPrimitiveTypes = out->mPrimitiveTypes | 8;
              if (uVar51 != 0) goto LAB_00172c84;
            }
            local_168 = local_e8;
            piVar30 = local_e0;
          }
          else {
            local_194 = local_194 + uVar51;
          }
          piVar30 = piVar30 + 1;
          puVar41 = local_68 + 1;
        } while (piVar30 != local_70);
      }
      model_00 = local_78;
      iVar53._M_current = (aiAnimMesh **)out;
      ConvertMaterialForMesh(local_f8,out,local_78,local_190,(uint)local_178);
      if ((char)local_f0 != '\0') {
        iVar53._M_current = (aiAnimMesh **)out;
        ConvertWeights(local_f8,out,model_00,local_190,local_80,(uint)local_178,&local_d8);
      }
      local_118 = (void *)0x0;
      iStack_110._M_current = (aiAnimMesh **)0x0;
      local_108 = (aiAnimMesh **)0x0;
      pvVar31 = Geometry::GetBlendShapes(&local_190->super_Geometry);
      ppaVar34 = (pointer *)
                 (pvVar31->
                 super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      local_178 = (pvVar31->
                  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      if ((pointer)ppaVar34 != local_178) {
        do {
          ppaVar43 = *(pointer **)(*ppaVar34 + 6);
          local_140 = *(vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> **)
                       &(*ppaVar34)[6].z;
          local_148 = ppaVar34;
          if ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)ppaVar43 !=
              local_140) {
            do {
              local_170 = *ppaVar43;
              lVar35._0_4_ = local_170[9].y;
              lVar35._4_4_ = local_170[9].z;
              local_180 = ppaVar43;
              if (lVar35 != *(long *)&local_170[8].z) {
                uVar38 = 0;
                do {
                  local_158 = aiCreateAnimMesh(out);
                  if ((ulong)(*(long *)&local_170[9].y - *(long *)&local_170[8].z >> 3) <= uVar38) {
LAB_0017350c:
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar38);
                    goto LAB_0017351d;
                  }
                  this_00 = *(ShapeGeometry **)(*(long *)&local_170[8].z + uVar38 * 8);
                  local_160 = ShapeGeometry::GetVertices(this_00);
                  local_168 = (aiFace *)ShapeGeometry::GetNormals(this_00);
                  pvVar44 = ShapeGeometry::GetIndices(this_00);
                  paVar25 = local_158;
                  FixAnimMeshName(&local_b8,(FBXConverter *)iVar53._M_current,
                                  &(this_00->super_Geometry).super_Object.name);
                  sVar26 = local_b8._M_string_length;
                  if (local_b8._M_string_length < 0x400) {
                    (paVar25->mName).length = (ai_uint32)local_b8._M_string_length;
                    memcpy((paVar25->mName).data,
                           (void *)CONCAT44(local_b8._M_dataplus._M_p._4_4_,
                                            (uint)local_b8._M_dataplus._M_p),
                           local_b8._M_string_length);
                    (paVar25->mName).data[sVar26] = '\0';
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_b8._M_dataplus._M_p._4_4_,(uint)local_b8._M_dataplus._M_p)
                      != &local_b8.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_b8._M_dataplus._M_p._4_4_,
                                             (uint)local_b8._M_dataplus._M_p));
                  }
                  puVar45 = (pvVar44->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start;
                  if ((pvVar44->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish != puVar45) {
                    uVar50 = 0;
                    do {
                      paVar28 = (local_160->
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      uVar52 = ((long)(local_160->
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)paVar28 >>
                               2) * -0x5555555555555555;
                      if (uVar52 < uVar50 || uVar52 - uVar50 == 0) {
LAB_001734fb:
                        std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,uVar50);
                        goto LAB_0017350c;
                      }
                      lVar35 = *(long *)local_168;
                      uVar52 = ((long)local_168->mIndices - lVar35 >> 2) * -0x5555555555555555;
                      if (uVar52 < uVar50 || uVar52 - uVar50 == 0) {
                        std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,uVar50);
                        goto LAB_001734fb;
                      }
                      local_128 = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                                   (paVar28 + uVar50);
                      uStack_120 = 0;
                      local_150 = (pointer)CONCAT44(local_150._4_4_,paVar28[uVar50].z);
                      local_138 = *(vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    **)(lVar35 + uVar50 * 0xc);
                      uStack_130 = 0;
                      local_188 = CONCAT44(local_188._4_4_,
                                           *(undefined4 *)(lVar35 + 8 + uVar50 * 0xc));
                      local_b8._M_dataplus._M_p._0_4_ = 0;
                      puVar41 = MeshGeometry::ToOutputVertexIndex
                                          (local_190,puVar45[uVar50],(uint *)&local_b8);
                      if ((uint)local_b8._M_dataplus._M_p != 0) {
                        uVar52 = 0;
                        do {
                          local_ec = puVar41[uVar52];
                          p_Var27 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
                          p_Var57 = &p_Var3->_M_header;
                          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent !=
                              (_Base_ptr)0x0) {
                            do {
                              p_Var56 = p_Var57;
                              p_Var49 = p_Var27;
                              _Var14 = p_Var49[1]._M_color;
                              p_Var57 = p_Var49;
                              if (_Var14 < local_ec) {
                                p_Var57 = p_Var56;
                              }
                              p_Var27 = (&p_Var49->_M_left)[_Var14 < local_ec];
                            } while ((&p_Var49->_M_left)[_Var14 < local_ec] != (_Base_ptr)0x0);
                            if ((_Rb_tree_header *)p_Var57 != p_Var3) {
                              if (_Var14 < local_ec) {
                                p_Var49 = p_Var56;
                              }
                              if (p_Var49[1]._M_color <= local_ec) {
                                pmVar42 = std::
                                          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                          ::operator[]((
                                                  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                                  *)&local_60,&local_ec);
                                uVar51 = *pmVar42;
                                paVar32 = local_158->mVertices;
                                uVar4 = paVar32[uVar51].x;
                                uVar9 = paVar32[uVar51].y;
                                paVar32[uVar51].x = (float)uVar4 + (float)local_128;
                                paVar32[uVar51].y = (float)uVar9 + local_128._4_4_;
                                paVar32[uVar51].z = paVar32[uVar51].z + local_150._0_4_;
                                paVar32 = local_158->mNormals;
                                if (paVar32 != (aiVector3D *)0x0) {
                                  uVar5 = paVar32[uVar51].x;
                                  uVar10 = paVar32[uVar51].y;
                                  paVar32[uVar51].x = (float)uVar5 + (float)local_138;
                                  paVar32[uVar51].y = (float)uVar10 + local_138._4_4_;
                                  paVar32[uVar51].z = paVar32[uVar51].z + (float)local_188;
                                  paVar32 = local_158->mNormals;
                                  uVar6 = paVar32[uVar51].x;
                                  uVar11 = paVar32[uVar51].y;
                                  fVar59 = paVar32[uVar51].z;
                                  fVar60 = SQRT(fVar59 * fVar59 +
                                                (float)uVar6 * (float)uVar6 +
                                                (float)uVar11 * (float)uVar11);
                                  if (0.0 < fVar60) {
                                    paVar32 = paVar32 + uVar51;
                                    fVar60 = 1.0 / fVar60;
                                    paVar32->x = (float)uVar6 * fVar60;
                                    paVar32->y = (float)uVar11 * fVar60;
                                    paVar32->z = fVar59 * fVar60;
                                  }
                                }
                              }
                            }
                          }
                          uVar52 = uVar52 + 1;
                        } while (uVar52 < (uint)local_b8._M_dataplus._M_p);
                      }
                      uVar50 = uVar50 + 1;
                      puVar45 = (pvVar44->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                    } while (uVar50 < (ulong)((long)(pvVar44->
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)puVar45 >> 2));
                  }
                  fVar59 = 1.0;
                  if (8 < (ulong)(*(long *)&local_170[9].y - *(long *)&local_170[8].z)) {
                    fVar59 = local_170[6].x / 100.0;
                  }
                  local_158->mWeight = fVar59;
                  iVar53._M_current = iStack_110._M_current;
                  if (iStack_110._M_current == local_108) {
                    std::vector<aiAnimMesh*,std::allocator<aiAnimMesh*>>::
                    _M_realloc_insert<aiAnimMesh*const&>
                              ((vector<aiAnimMesh*,std::allocator<aiAnimMesh*>> *)&local_118,
                               iStack_110,&local_158);
                  }
                  else {
                    *iStack_110._M_current = local_158;
                    iStack_110._M_current = iStack_110._M_current + 1;
                  }
                  uVar38 = uVar38 + 1;
                } while (uVar38 < (ulong)(*(long *)&local_170[9].y - *(long *)&local_170[8].z >> 3))
                ;
              }
              ppaVar43 = local_180 + 1;
            } while ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)ppaVar43 !=
                     local_140);
          }
          ppaVar34 = local_148 + 1;
        } while ((pointer)ppaVar34 != local_178);
      }
      if ((long)iStack_110._M_current - (long)local_118 != 0) {
        uVar38 = (long)iStack_110._M_current - (long)local_118 >> 3;
        out->mNumAnimMeshes = (uint)uVar38;
        ppaVar46 = (aiAnimMesh **)
                   operator_new__(-(ulong)(uVar38 >> 0x3d != 0) |
                                  (long)iStack_110._M_current - (long)local_118);
        out->mAnimMeshes = ppaVar46;
        uVar50 = 0;
        do {
          if ((ulong)((long)iStack_110._M_current - (long)local_118 >> 3) <= uVar50)
          goto LAB_0017351d;
          out->mAnimMeshes[uVar50] = *(aiAnimMesh **)((long)local_118 + uVar50 * 8);
          uVar50 = uVar50 + 1;
        } while (uVar38 + (uVar38 == 0) != uVar50);
      }
      ppaVar18 = (local_f8->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppaVar19 = (local_f8->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (local_118 != (void *)0x0) {
        operator_delete(local_118);
      }
      if (local_98 != (pointer)0x0) {
        operator_delete(local_98);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&local_60);
      if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return (int)((ulong)((long)ppaVar19 - (long)ppaVar18) >> 3) - 1;
    }
  }
LAB_0017352b:
  __assert_fail("count_faces",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                ,0x4ec,
                "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, const aiMatrix4x4 &, aiNode &)"
               );
LAB_0017351d:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  goto LAB_0017352b;
}

Assistant:

unsigned int FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry& mesh, const Model& model,
            MatIndexArray::value_type index,
            const aiMatrix4x4& node_global_transform,
            aiNode& nd)
        {
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, nd);

            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            const bool process_weights = doc.Settings().readWeights && mesh.DeformerSkin() != NULL;

            unsigned int count_faces = 0;
            unsigned int count_vertices = 0;

            // count faces
            std::vector<unsigned int>::const_iterator itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(),
                end = mindices.end(); it != end; ++it, ++itf)
            {
                if ((*it) != index) {
                    continue;
                }
                ++count_faces;
                count_vertices += *itf;
            }

            ai_assert(count_faces);
            ai_assert(count_vertices);

            // mapping from output indices to DOM indexing, needed to resolve weights or blendshapes
            std::vector<unsigned int> reverseMapping;
            std::map<unsigned int, unsigned int> translateIndexMap;
            if (process_weights || mesh.GetBlendShapes().size() > 0) {
                reverseMapping.resize(count_vertices);
            }

            // allocate output data arrays, but don't fill them yet
            out_mesh->mNumVertices = count_vertices;
            out_mesh->mVertices = new aiVector3D[count_vertices];

            out_mesh->mNumFaces = count_faces;
            aiFace* fac = out_mesh->mFaces = new aiFace[count_faces]();


            // allocate normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());
                out_mesh->mNormals = new aiVector3D[vertices.size()];
            }

            // allocate tangents, binormals.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();
            std::vector<aiVector3D> tempBinormals;

            if (tangents.size()) {
                if (!binormals->size()) {
                    if (normals.size()) {
                        // XXX this computes the binormals for the entire mesh, not only
                        // the part for which we need them.
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = NULL;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size() && binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                }
            }

            // allocate texture coords
            unsigned int num_uvs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i, ++num_uvs) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                out_mesh->mNumUVComponents[i] = 2;
            }

            // allocate vertex colors
            unsigned int num_vcs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i, ++num_vcs) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
            }

            unsigned int cursor = 0, in_cursor = 0;

            itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(), end = mindices.end(); it != end; ++it, ++itf)
            {
                const unsigned int pcount = *itf;
                if ((*it) != index) {
                    in_cursor += pcount;
                    continue;
                }

                aiFace& f = *fac++;

                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i, ++cursor, ++in_cursor) {
                    f.mIndices[i] = cursor;

                    if (reverseMapping.size()) {
                        reverseMapping[cursor] = in_cursor;
                        translateIndexMap[in_cursor] = cursor;
                    }

                    out_mesh->mVertices[cursor] = vertices[in_cursor];

                    if (out_mesh->mNormals) {
                        out_mesh->mNormals[cursor] = normals[in_cursor];
                    }

                    if (out_mesh->mTangents) {
                        out_mesh->mTangents[cursor] = tangents[in_cursor];
                        out_mesh->mBitangents[cursor] = (*binormals)[in_cursor];
                    }

                    for (unsigned int j = 0; j < num_uvs; ++j) {
                        const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(j);
                        out_mesh->mTextureCoords[j][cursor] = aiVector3D(uvs[in_cursor].x, uvs[in_cursor].y, 0.0f);
                    }

                    for (unsigned int j = 0; j < num_vcs; ++j) {
                        const std::vector<aiColor4D>& cols = mesh.GetVertexColors(j);
                        out_mesh->mColors[j][cursor] = cols[in_cursor];
                    }
                }
            }

            ConvertMaterialForMesh(out_mesh, model, mesh, index);

            if (process_weights) {
                ConvertWeights(out_mesh, model, mesh, node_global_transform, index, &reverseMapping);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh* animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int outIndex = outIndices[k];
                                if (translateIndexMap.find(outIndex) == translateIndexMap.end())
                                    continue;
                                unsigned int index = translateIndexMap[outIndex];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }

            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }

            return static_cast<unsigned int>(meshes.size() - 1);
        }